

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling1D::make_padding
          (Pooling1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  void *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  Option opt_b_3;
  int wpad_1;
  Option opt_b_2;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int wtail;
  int wtailpad;
  float pad_value;
  int w;
  undefined4 local_194;
  float v;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  Mat *in_stack_fffffffffffffe98;
  Mat *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeb0;
  Option *in_stack_fffffffffffffeb8;
  undefined1 local_130 [8];
  undefined8 local_128;
  int local_ec;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  int local_68;
  int local_64;
  undefined4 local_60;
  int local_5c;
  void *local_58;
  undefined8 *local_48;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  int local_18;
  undefined4 local_14;
  void *local_8;
  
  local_5c = *(int *)((long)in_RSI + 0x2c);
  local_58 = in_RCX;
  local_48 = in_RSI;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != 0) {
      piVar1 = (int *)in_RSI[1];
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_30 = in_RSI;
    if (in_RDX[1] != 0) {
      piVar1 = (int *)in_RDX[1];
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (in_RDX[4] == 0) {
          local_8 = (void *)*in_RDX;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = 0;
    in_RDX[2] = 0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = 0;
    in_RDX[1] = 0;
    *in_RDX = *local_30;
    in_RDX[1] = local_30[1];
    in_RDX[2] = local_30[2];
    *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(local_30 + 3);
    in_RDX[4] = local_30[4];
    *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(local_30 + 5);
    *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_30 + 0x2c);
    *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(local_30 + 6);
    *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_30 + 0x34);
    *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(local_30 + 7);
    in_RDX[8] = local_30[8];
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_194 = 0xc3000000;
    if (local_48[2] != 1) {
      local_194 = 0xff7fffff;
    }
    local_60 = local_194;
  }
  else {
    local_60 = 0;
  }
  local_64 = 0;
  v = (float)((ulong)in_RDX >> 0x20);
  if (*(int *)(in_RDI + 0xe8) == 0) {
    local_68 = ((local_5c + *(int *)(in_RDI + 0xdc) + *(int *)(in_RDI + 0xe0)) -
               *(int *)(in_RDI + 0xd4)) % *(int *)(in_RDI + 0xd8);
    if (local_68 != 0) {
      local_64 = *(int *)(in_RDI + 0xd8) - local_68;
    }
    memcpy(local_a8,local_58,0x40);
    local_a0 = *(undefined8 *)((long)local_58 + 0x10);
    copy_make_border(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffeb0,v
                     ,in_stack_fffffffffffffeb8);
  }
  else if (*(int *)(in_RDI + 0xe8) == 1) {
    memcpy(local_e8,local_58,0x40);
    local_e0 = *(undefined8 *)((long)local_58 + 0x10);
    copy_make_border(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffeb0,v
                     ,in_stack_fffffffffffffeb8);
  }
  else if (*(int *)(in_RDI + 0xe8) == 2) {
    local_ec = (*(int *)(in_RDI + 0xd4) +
               ((local_5c + -1) / *(int *)(in_RDI + 0xd8)) * *(int *)(in_RDI + 0xd8)) - local_5c;
    if (0 < local_ec) {
      memcpy(local_130,local_58,0x40);
      local_128 = *(undefined8 *)((long)local_58 + 0x10);
      copy_make_border(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                       in_stack_fffffffffffffe88,in_stack_fffffffffffffeb0,v,
                       in_stack_fffffffffffffeb8);
    }
  }
  else if ((*(int *)(in_RDI + 0xe8) == 3) &&
          (0 < (*(int *)(in_RDI + 0xd4) +
               ((local_5c + -1) / *(int *)(in_RDI + 0xd8)) * *(int *)(in_RDI + 0xd8)) - local_5c)) {
    memcpy(&stack0xfffffffffffffe88,local_58,0x40);
    copy_make_border(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (int)((ulong)*(undefined8 *)((long)local_58 + 0x10) >> 0x20),
                     (int)*(undefined8 *)((long)local_58 + 0x10),in_stack_fffffffffffffe8c,
                     in_stack_fffffffffffffe88,in_stack_fffffffffffffeb0,v,in_stack_fffffffffffffeb8
                    );
  }
  return;
}

Assistant:

void Pooling1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;

        if (wtail != 0)
            wtailpad = stride_w - wtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}